

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value,Arena *value_arena,Arena *my_arena)

{
  Arena *in_RCX;
  Arena *in_RDX;
  string *in_RDI;
  Type *new_value;
  Arena *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  if ((in_RCX == (Arena *)0x0) || (in_RDX != (Arena *)0x0)) {
    if (in_RCX != in_RDX) {
      StringTypeHandler::NewFromPrototype(in_RDI,in_stack_ffffffffffffffc8);
      StringTypeHandler::Merge(in_RDI,(string *)in_stack_ffffffffffffffc8);
      StringTypeHandler::Delete(in_RDI,in_stack_ffffffffffffffc8);
    }
  }
  else {
    Arena::Own<std::__cxx11::string>(in_RCX,in_stack_ffffffffffffffd8);
  }
  UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            ((RepeatedPtrFieldBase *)in_RDI,(Type *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void RepeatedPtrFieldBase::AddAllocatedSlowWithCopy(
    // Pass value_arena and my_arena to avoid duplicate virtual call (value) or
    // load (mine).
    typename TypeHandler::Type* value, Arena* value_arena, Arena* my_arena) {
  // Ensure that either the value is in the same arena, or if not, we do the
  // appropriate thing: Own() it (if it's on heap and we're in an arena) or copy
  // it to our arena/heap (otherwise).
  if (my_arena != NULL && value_arena == NULL) {
    my_arena->Own(value);
  } else if (my_arena != value_arena) {
    typename TypeHandler::Type* new_value =
        TypeHandler::NewFromPrototype(value, my_arena);
    TypeHandler::Merge(*value, new_value);
    TypeHandler::Delete(value, value_arena);
    value = new_value;
  }

  UnsafeArenaAddAllocated<TypeHandler>(value);
}